

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

Instr * __thiscall
Inline::TryGetCallbackDefInstrForCallApplyTarget(Inline *this,Instr *callApplyLdInstr)

{
  code *pcVar1;
  bool bVar2;
  Opnd *pOVar3;
  SymOpnd *this_00;
  PropertySymOpnd *this_01;
  StackSym *callbackSym_00;
  undefined4 *puVar4;
  Instr *pIVar5;
  StackSym *callbackSym;
  Instr *callApplyLdInstr_local;
  Inline *this_local;
  
  pOVar3 = IR::Instr::GetSrc1(callApplyLdInstr);
  bVar2 = IR::Opnd::IsSymOpnd(pOVar3);
  if (bVar2) {
    pOVar3 = IR::Instr::GetSrc1(callApplyLdInstr);
    this_00 = IR::Opnd::AsSymOpnd(pOVar3);
    bVar2 = IR::SymOpnd::IsPropertySymOpnd(this_00);
    if (bVar2) {
      pOVar3 = IR::Instr::GetSrc1(callApplyLdInstr);
      this_01 = IR::Opnd::AsPropertySymOpnd(pOVar3);
      callbackSym_00 = IR::PropertySymOpnd::GetObjectSym(this_01);
      if (callbackSym_00 == (StackSym *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x404,"(callbackSym != nullptr)","callbackSym != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      pIVar5 = TryGetCallbackDefInstr(this,callbackSym_00);
      return pIVar5;
    }
  }
  return (Instr *)0x0;
}

Assistant:

IR::Instr * Inline::TryGetCallbackDefInstrForCallApplyTarget(IR::Instr * callApplyLdInstr)
{
    // Try to find a function argument that could be inlined.
    if (!callApplyLdInstr->GetSrc1()->IsSymOpnd() || !callApplyLdInstr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())
    {
        return nullptr;
    }
    StackSym * callbackSym = callApplyLdInstr->GetSrc1()->AsPropertySymOpnd()->GetObjectSym();
    Assert(callbackSym != nullptr);
    return TryGetCallbackDefInstr(callbackSym);
}